

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::internal::OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)>::OnCallSpec
          (OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> *this,char *a_file,
          int a_line,ArgumentMatcherTuple *matchers)

{
  MatcherInterface<fmt::v5::basic_string_view<wchar_t>_> *pMVar1;
  MatcherInterface<const_std::tr1::tuple<fmt::v5::basic_string_view<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  *pMVar2;
  linked_ptr_internal *this_00;
  
  (this->super_UntypedOnCallSpecBase).file_ = a_file;
  (this->super_UntypedOnCallSpecBase).line_ = a_line;
  (this->super_UntypedOnCallSpecBase).last_clause_ = kNone;
  (this->matchers_).f0_.super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d4088;
  pMVar1 = (matchers->f0_).super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>.impl_.value_;
  (this->matchers_).f0_.super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>.impl_.value_ =
       pMVar1;
  this_00 = &(this->matchers_).f0_.super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>.impl_.
             link_;
  if (pMVar1 == (MatcherInterface<fmt::v5::basic_string_view<wchar_t>_> *)0x0) {
    this_00->next_ = this_00;
  }
  else {
    linked_ptr_internal::join
              (this_00,&(matchers->f0_).super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>.
                        impl_.link_);
  }
  (this->matchers_).f0_.super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d8008;
  pMVar2 = (MatcherInterface<const_std::tr1::tuple<fmt::v5::basic_string_view<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
            *)operator_new(8);
  (pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001d8110;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tr1::tuple<fmt::v5::basic_string_view<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  .impl_.value_ = pMVar2;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tr1::tuple<fmt::v5::basic_string_view<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  .impl_.link_.next_ =
       &(this->extra_matcher_).
        super_MatcherBase<const_std::tr1::tuple<fmt::v5::basic_string_view<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
        .impl_.link_;
  (this->extra_matcher_).
  super_MatcherBase<const_std::tr1::tuple<fmt::v5::basic_string_view<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001d80d8;
  (this->action_).impl_.value_ =
       (ActionInterface<test_result_(fmt::v5::basic_string_view<wchar_t>)> *)0x0;
  (this->action_).impl_.link_.next_ = &(this->action_).impl_.link_;
  return;
}

Assistant:

OnCallSpec(const char* a_file, int a_line,
             const ArgumentMatcherTuple& matchers)
      : UntypedOnCallSpecBase(a_file, a_line),
        matchers_(matchers),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that triggers a compiler
        // bug in Symbian's C++ compiler (cannot decide between two
        // overloaded constructors of Matcher<const ArgumentTuple&>).
        extra_matcher_(A<const ArgumentTuple&>()) {
  }